

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Minisat::DoubleOption::printOptions(DoubleOption *this,FILE *pcsFile,int granularity)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_58;
  double local_48;
  
  pcVar2 = strstr((this->super_Option).name,"debug");
  if (pcVar2 != (char *)0x0) {
    return;
  }
  pcVar2 = strstr((this->super_Option).description,"debug");
  if (pcVar2 != (char *)0x0) {
    return;
  }
  iVar1 = (*(this->super_Option)._vptr_Option[10])(this);
  if ((char)iVar1 == '\0') {
    return;
  }
  dVar8 = 0.0;
  local_48 = 0.0;
  if ((this->range).begin_inclusive == false) {
    local_48 = 0.0001;
  }
  if ((this->range).end_inclusive == false) {
    dVar8 = 0.0001;
  }
  dVar7 = (this->range).end;
  if (dVar7 < INFINITY) {
    local_58 = dVar7 - dVar8;
  }
  else {
    local_58 = 1000000.0;
    if (1000000.0 < this->defaultValue) {
      local_58 = this->defaultValue;
    }
  }
  if (granularity == 0) {
    local_48 = local_48 + (this->range).begin;
    if ((0.0 < local_48) || (dVar7 < dVar8)) {
      pcVar2 = "%s  [%lf,%lf] [%lf]l   # %s\n";
    }
    else {
      pcVar2 = "%s  [%lf,%lf] [%lf]    # %s\n";
    }
    fprintf((FILE *)pcsFile,pcVar2,local_48,local_58,this->value,(this->super_Option).name,
            (this->super_Option).description);
    return;
  }
  fprintf((FILE *)pcsFile,"%s  {",(this->super_Option).name);
  if (granularity < 2) {
    fprintf((FILE *)pcsFile,",%.4lf",this->value);
  }
  else {
    dVar8 = (this->range).begin + local_48;
    dVar7 = local_58 - dVar8;
    bVar3 = false;
    bVar4 = false;
    for (; dVar8 <= local_58; dVar8 = dVar8 + dVar7 / (double)(granularity + -1)) {
      dVar5 = (this->range).begin + local_48;
      if ((dVar8 != dVar5) || (NAN(dVar8) || NAN(dVar5))) {
        fputc(0x2c,(FILE *)pcsFile);
      }
      fprintf((FILE *)pcsFile,"%.4lf",dVar8);
      dVar5 = round(dVar8 * 10000.0);
      dVar6 = round(this->defaultValue * 10000.0);
      bVar3 = (bool)(bVar3 | dVar5 == dVar6);
      dVar6 = round(this->value * 10000.0);
      bVar4 = (bool)(bVar4 | dVar5 == dVar6);
    }
    if (!bVar4) {
      fprintf((FILE *)pcsFile,",%.4lf",this->value);
    }
    if (bVar3) goto LAB_00120098;
  }
  dVar8 = this->defaultValue;
  dVar7 = round(dVar8 * 10000.0);
  dVar5 = round(this->value * 10000.0);
  if ((dVar7 != dVar5) || (NAN(dVar7) || NAN(dVar5))) {
    fprintf((FILE *)pcsFile,",%.4lf",dVar8);
  }
LAB_00120098:
  fprintf((FILE *)pcsFile,"} [%.4lf]    # %s\n",this->value,(this->super_Option).description);
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {
        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        // choose between logarithmic scale and linear scale based on the number of elements in the list - more than 16 elements means it should be log (simple heuristic)
        double badd = 0, esub = 0;
        if (!range.begin_inclusive) {
            badd = 0.0001;
        }
        if (!range.end_inclusive) {
            esub = 0.0001;
        }
        // always logarithmic
        double endValue = range.end == HUGE_VAL ? (defaultValue > 1000000.0 ? defaultValue : 1000000.0) : range.end - esub;
        if (granularity == 0) { // use interval
            if (range.begin + badd > 0 || range.end - esub < 0) {
                fprintf(pcsFile, "%s  [%lf,%lf] [%lf]l   # %s\n", name, range.begin + badd, endValue, value, description);
            } else {
                fprintf(pcsFile, "%s  [%lf,%lf] [%lf]    # %s\n", name, range.begin + badd, endValue, value, description);
            }
        } else {                             // print linear distributed sampling for double option
            fprintf(pcsFile, "%s  {", name); // print name
            bool hitDefault = false;
            bool hitValue = false;
            if (granularity > 1) {
                double diff = (endValue - (range.begin + badd)) / (double)(granularity - 1);
                for (double v = range.begin + badd; v <= endValue; v += diff) {
                    if (v != range.begin + badd) {
                        fprintf(pcsFile, ",");
                    }                             // print comma, if there will be more and we printed one item already
                    fprintf(pcsFile, "%.4lf", v); // print current value
                    if (round(v * 10000) == round(defaultValue * 10000)) {
                        hitDefault = true;
                    } // otherwise we run into precision problems
                    if (round(v * 10000) == round(value * 10000)) {
                        hitValue = true;
                    } // otherwise we run into precision problems
                }
            }
            if (!hitValue) {
                fprintf(pcsFile, ",%.4lf", value);
            } // print current value of option as well!
            if (!hitDefault && round(defaultValue * 10000) != round(value * 10000)) {
                fprintf(pcsFile, ",%.4lf", defaultValue);
            } // print default value of option as well!
            fprintf(pcsFile, "} [%.4lf]    # %s\n", value, description);
        }
    }